

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

BYTE __thiscall Spi::recv_byte(Spi *this)

{
  ostream *this_00;
  int local_2c;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  int local_1c;
  BYTE local_15;
  DWORD dwNumBytesRead;
  BYTE byInputBuffer [1];
  Spi *pSStack_10;
  FT_STATUS ftStatus;
  Spi *this_local;
  
  local_1c = 0;
  pSStack_10 = this;
  while( true ) {
    dwNumBytesRead = FT_Read(this->ftHandle,&local_15,1,&local_1c);
    if (dwNumBytesRead != 0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Read error.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      error(this,2);
    }
    if (local_1c == 1) break;
    local_2c = 100;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000l>> *)&local_28,&local_2c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_28);
  }
  return local_15;
}

Assistant:

BYTE Spi::recv_byte() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;
	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK) {
			cerr << "Read error." << endl;
			error(2);
		}
		if (dwNumBytesRead == 1)
			break;
		std::this_thread::sleep_for(std::chrono::microseconds(100));
	}
	return byInputBuffer[0];
}